

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::addEdge(CFG *this,CfgNode *src,CfgNode *dst,unsigned_long_long count)

{
  CfgEdge *this_00;
  mapped_type *pmVar1;
  bool local_81;
  bool local_71;
  CfgEdge *local_30;
  CfgEdge *edge;
  unsigned_long_long count_local;
  CfgNode *dst_local;
  CfgNode *src_local;
  CFG *this_local;
  
  local_71 = false;
  edge = (CfgEdge *)count;
  count_local = (unsigned_long_long)dst;
  dst_local = src;
  src_local = (CfgNode *)this;
  if (src != (CfgNode *)0x0) {
    local_71 = containsNode(this,src);
  }
  if (local_71 == false) {
    __assert_fail("src != 0 && this->containsNode(src)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                  ,0x6b,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
  }
  local_81 = false;
  if (count_local != 0) {
    local_81 = containsNode(this,(CfgNode *)count_local);
  }
  if (local_81 == false) {
    __assert_fail("dst != 0 && this->containsNode(dst)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                  ,0x6c,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
  }
  local_30 = findEdge(this,dst_local,(CfgNode *)count_local);
  if (local_30 == (CfgEdge *)0x0) {
    this_00 = (CfgEdge *)operator_new(0x20);
    CfgEdge::CfgEdge(this_00,dst_local,(CfgNode *)count_local,(unsigned_long_long)edge);
    local_30 = this_00;
    std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::insert
              (&this->m_edges,&local_30);
    pmVar1 = std::
             map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
             ::operator[](&this->m_succs,&dst_local);
    std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::insert
              (pmVar1,(value_type *)&count_local);
    pmVar1 = std::
             map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
             ::operator[](&this->m_preds,(key_type *)&count_local);
    std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::insert(pmVar1,&dst_local)
    ;
    this->m_status = UNCHECKED;
  }
  else {
    CfgEdge::updateCount(local_30,(unsigned_long_long)edge);
  }
  return;
}

Assistant:

void CFG::addEdge(CfgNode* src, CfgNode* dst, unsigned long long count) {
	assert(src != 0 && this->containsNode(src));
	assert(dst != 0 && this->containsNode(dst));

	CfgEdge* edge = this->findEdge(src, dst);
	if (edge)
		// Update edge count if already added.
		edge->updateCount(count);
	else {
		// Create and add edge.
		edge = new CfgEdge(src, dst, count);
		m_edges.insert(edge);

		m_succs[src].insert(dst);
		m_preds[dst].insert(src);

		m_status = CFG::UNCHECKED;
	}
}